

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall AST::AST(AST *this,string *filename)

{
  _Elt_pointer ppPVar1;
  _Elt_pointer ppPVar2;
  bool bVar3;
  ostream *poVar4;
  GLRP *pGVar5;
  GLRParser *this_00;
  ASTree *this_01;
  _Elt_pointer ppPVar6;
  string *psVar7;
  _Base_ptr p_Var8;
  runtime_error *this_02;
  set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
  parsedVersions;
  string parseString;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonTerminals;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  glrNonTerminals;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> productions;
  string local_3e0;
  stringstream buffer;
  ostream local_3b0 [376];
  ifstream t;
  streambuf local_228 [504];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Creating an AST for ");
  poVar4 = std::operator<<(poVar4,(string *)filename);
  std::endl<char,std::char_traits<char>>(poVar4);
  pGVar5 = GLRP::getInstance();
  bVar3 = GLRP::isLoaded(pGVar5);
  if (!bVar3) {
    pGVar5 = GLRP::getInstance();
    GLRP::loadParser(pGVar5);
  }
  pGVar5 = GLRP::getInstance();
  this_00 = GLRP::getGlrParser(pGVar5);
  poVar4 = std::operator<<((ostream *)&std::cout,"Parsing string...");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ifstream::ifstream(&t,(string *)filename,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  std::ostream::operator<<(local_3b0,local_228);
  std::__cxx11::stringbuf::str();
  GLRParser::parseString(&parsedVersions,this_00,&parseString);
  poVar4 = std::operator<<((ostream *)&std::cout,"Done parsing");
  std::endl<char,std::char_traits<char>>(poVar4);
  if (parsedVersions._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
    if (parsedVersions._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error parsing: Incorrect code");
      std::endl<char,std::char_traits<char>>(poVar4);
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"Parsing error");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Error parsing: Code has ambiguities, taking the first one");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  GLRParser::getNonTerminalsV_abi_cxx11_(&glrNonTerminals,this_00);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  set<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&nonTerminals,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )glrNonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&glrNonTerminals._M_t._M_impl.super__Rb_tree_header);
  for (p_Var8 = parsedVersions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &parsedVersions._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    std::deque<Production_*,_std::allocator<Production_*>_>::deque
              ((deque<Production_*,_std::allocator<Production_*>_> *)&productions,
               (deque<Production_*,_std::allocator<Production_*>_> *)(p_Var8 + 1));
    ppPVar2 = productions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    ppPVar1 = productions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    if (productions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        productions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Empty productions");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      this_01 = (ASTree *)operator_new(0x40);
      ppPVar6 = ppPVar2;
      if (ppPVar2 ==
          productions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppPVar6 = productions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      psVar7 = Production::getFromP_abi_cxx11_(ppPVar6[-1]);
      std::__cxx11::string::string((string *)&local_3e0,(string *)psVar7);
      ASTree::ASTree(this_01,&productions,&nonTerminals,&local_3e0,(ASTree *)0x0);
      this->ast = this_01;
      std::__cxx11::string::~string((string *)&local_3e0);
    }
    std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base
              ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)&productions);
    if (ppPVar2 == ppPVar1) break;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&nonTerminals._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&glrNonTerminals._M_t);
  std::
  _Rb_tree<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::_Identity<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
  ::~_Rb_tree(&parsedVersions._M_t);
  std::__cxx11::string::~string((string *)&parseString);
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  std::ifstream::~ifstream(&t);
  return;
}

Assistant:

AST::AST(std::string filename) {

    std::cout << "Creating an AST for " << filename << std::endl;

    if (!GLRP::getInstance().isLoaded()) {
        GLRP::getInstance().loadParser();
    }
    GLRParser *glrParser = GLRP::getInstance().getGlrParser();

//      glrParser->toDot("output/glrParser.dot");

    std::cout << "Parsing string..." << std::endl;

    // Get the contents of the file (Source: https://stackoverflow.com/questions/2602013/read-whole-ascii-file-into-c-stdstring)
    std::ifstream t(filename);
    std::stringstream buffer;
    buffer << t.rdbuf();
    std::string parseString = buffer.str();

    // Parse the contents of the file
    std::set<std::stack<Production *>> parsedVersions = glrParser->parseString(parseString);

    std::cout << "Done parsing" << std::endl;


    // Analyze the result of the parsing
    if (parsedVersions.size() == 0) {
        // No possible parse combinations found
        std::cerr << "Error parsing: Incorrect code" << std::endl;
        throw std::runtime_error("Parsing error");
    } else {

        if (parsedVersions.size() > 1) {
            // Multiple parse combinations possible
            std::cerr << "Error parsing: Code has ambiguities, taking the first one" << std::endl;
        }

        // One unique parse combination found

        // Transform the vector of nonTerminals in a set (Source: https://www.techiedelight.com/convert-vector-set-cpp/)
        std::set<std::string> glrNonTerminals = glrParser->getNonTerminalsV();
        std::set<std::string> nonTerminals(glrNonTerminals.begin(), glrNonTerminals.end());

//        // Get the only element in the set
//        std::stack<Production *> productions = *(parsedVersions.begin());

        int i = 0;
        for (auto productions: parsedVersions) {
            if (productions.empty()) {
                std::cerr << "Error: Empty productions" << std::endl;
                return;
            }
            // Create an ASTree with this list of productions
            ast = new ASTree(productions, nonTerminals, productions.top()->getFromP(), nullptr);
//            filename = "output/parsed" + std::to_string(i) + ".dot";
//            ast->toDot(filename);
            i++;
        }
    }
}